

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.cpp
# Opt level: O2

czstring pstore::threads::get_name(span<char,_16L> name)

{
  errno_erc erc;
  pthread_t __target_thread;
  
  if (name.storage_.data_ == (pointer)0x0) {
    raise<pstore::errno_erc>((errno_erc)0x16);
  }
  __target_thread = pthread_self();
  erc.err_ = pthread_getname_np(__target_thread,(char *)name.storage_.data_,0x10);
  if (erc.err_ == 0) {
    *(undefined1 *)((long)name.storage_.data_ + 0xf) = 0;
    return name.storage_.data_.data_;
  }
  raise<pstore::errno_erc,char[18]>(erc,(char (*) [18])"threads::get_name");
}

Assistant:

gsl::czstring get_name (gsl::span<char, name_size> const name /*out*/) {
            auto const length = name.size ();
            if (name.data () == nullptr || length < 1) {
                raise (errno_erc{EINVAL});
            }

            PSTORE_ASSERT (length == name.size_bytes ());
            auto const length_u = unsigned_cast (length);
            int err = 0;
#    if USE_FALLBACK
            std::strncpy (name.data (), thread_name, length_u);
#    elif defined(PSTORE_PTHREAD_GETNAME_NP)
            err = pthread_getname_np (pthread_self (), name.data (), length_u);
#    elif defined(PSTORE_PTHREAD_GET_NAME_NP)
            pthread_get_name_np (pthread_self (), name.data (), length_u);
#    else
#        error "Don't know how to get the name of the current thread"
#    endif
            if (err != 0) {
                raise (errno_erc{err}, "threads::get_name");
            }
            name[length - 1] = '\0';
            return name.data ();
        }